

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void load_buffer_4x8(int16_t *input,__m128i *out,int stride,int flipud,int fliplr,int shift)

{
  int16_t *input_00;
  int16_t *input_01;
  
  input_00 = input + stride * 4;
  input_01 = input;
  if (flipud != 0) {
    input_01 = input_00;
    input_00 = input;
  }
  load_buffer_4x4(input_01,out,stride,flipud,fliplr,shift);
  load_buffer_4x4(input_00,out + 4,stride,flipud,fliplr,shift);
  return;
}

Assistant:

static inline void load_buffer_4x8(const int16_t *input, __m128i *out,
                                   int stride, int flipud, int fliplr,
                                   int shift) {
  const int16_t *topL = input;
  const int16_t *botL = input + 4 * stride;

  const int16_t *tmp;

  if (flipud) {
    tmp = topL;
    topL = botL;
    botL = tmp;
  }

  load_buffer_4x4(topL, out, stride, flipud, fliplr, shift);
  load_buffer_4x4(botL, out + 4, stride, flipud, fliplr, shift);
}